

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,GlobalVar *var)

{
  ExternalRef local_8;
  
  if (*(int *)&var[4].var == 1) {
    local_8.name = (string *)(var + 5);
    Write(this,&local_8);
    return;
  }
  __assert_fail("var.var.is_name()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/c-writer.cc"
                ,0x2d2,"void wabt::(anonymous namespace)::CWriter::Write(const GlobalVar &)");
}

Assistant:

void CWriter::Write(const GlobalVar& var) {
  assert(var.var.is_name());
  Write(ExternalRef(var.var.name()));
}